

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O0

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<2>::operator()
          (_defaultInitializer<2> *this,char (*param_1) [240],char *param_2)

{
  DeadlyImportError *this_00;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *param_2_local;
  char (*param_1_local) [240];
  _defaultInitializer<2> *this_local;
  
  local_20 = param_2;
  param_2_local = *param_1;
  param_1_local = (char (*) [240])this;
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Constructing BlenderDNA Structure encountered an error",&local_41)
  ;
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void operator ()(T& /*out*/,const char* = "") {
        // obviously, it is crucial that _DefaultInitializer is used
        // only from within a catch clause.
        throw DeadlyImportError("Constructing BlenderDNA Structure encountered an error");
    }